

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinfl.h
# Opt level: O3

void sinfl_build(uint *tbl,uchar *lens,int tbl_bits,int maxlen,int symcnt)

{
  ushort uVar1;
  int iVar2;
  int *piVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  ushort *puVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  int cnt [16];
  int off [16];
  short sort [288];
  int local_2f8 [32];
  ushort auStack_278 [292];
  
  local_2f8[0xc] = 0;
  local_2f8[0xd] = 0;
  local_2f8[0xe] = 0;
  local_2f8[0xf] = 0;
  local_2f8[8] = 0;
  local_2f8[9] = 0;
  local_2f8[10] = 0;
  local_2f8[0xb] = 0;
  local_2f8[4] = 0;
  local_2f8[5] = 0;
  local_2f8[6] = 0;
  local_2f8[7] = 0;
  local_2f8[0] = 0;
  local_2f8[1] = 0;
  local_2f8[2] = 0;
  local_2f8[3] = 0;
  local_2f8[0x1c] = 0;
  local_2f8[0x1d] = 0;
  local_2f8[0x1e] = 0;
  local_2f8[0x1f] = 0;
  local_2f8[0x18] = 0;
  local_2f8[0x19] = 0;
  local_2f8[0x1a] = 0;
  local_2f8[0x1b] = 0;
  local_2f8[0x14] = 0;
  local_2f8[0x15] = 0;
  local_2f8[0x16] = 0;
  local_2f8[0x17] = 0;
  local_2f8[0x10] = 0;
  local_2f8[0x11] = 0;
  local_2f8[0x12] = 0;
  local_2f8[0x13] = 0;
  iVar14 = 0;
  iVar10 = 0;
  if (0 < symcnt) {
    uVar9 = 0;
    do {
      local_2f8[lens[uVar9]] = local_2f8[lens[uVar9]] + 1;
      uVar9 = uVar9 + 1;
    } while ((uint)symcnt != uVar9);
    iVar10 = local_2f8[0];
  }
  local_2f8[0x11] = iVar10;
  uVar9 = 1;
  if (1 < maxlen) {
    uVar9 = (ulong)(uint)maxlen;
    lVar15 = 0;
    iVar14 = 0;
    do {
      iVar10 = iVar10 + local_2f8[lVar15 + 1];
      local_2f8[lVar15 + 0x12] = iVar10;
      iVar14 = local_2f8[lVar15 + 1] + iVar14 * 2;
      lVar15 = lVar15 + 1;
    } while (uVar9 - 1 != lVar15);
    iVar14 = iVar14 * 2;
  }
  iVar10 = local_2f8[uVar9];
  if (0 < symcnt) {
    uVar9 = 0;
    do {
      iVar13 = local_2f8[(ulong)lens[uVar9] + 0x10];
      local_2f8[(ulong)lens[uVar9] + 0x10] = iVar13 + 1;
      auStack_278[iVar13] = (ushort)uVar9;
      uVar9 = uVar9 + 1;
    } while ((uint)symcnt != uVar9);
  }
  uVar9 = 1;
  bVar4 = (byte)tbl_bits;
  if (iVar14 + iVar10 < 1 << ((byte)maxlen & 0x1f)) {
    lVar15 = 0;
    do {
      tbl[lVar15] = 1;
      lVar15 = lVar15 + 1;
    } while ((uint)lVar15 >> (bVar4 & 0x1f) == 0);
    return;
  }
  iVar14 = local_2f8[1];
  if (local_2f8[1] == 0) {
    lVar15 = 2;
    do {
      iVar14 = local_2f8[lVar15];
      lVar15 = lVar15 + 1;
    } while (iVar14 == 0);
    uVar9 = (ulong)((int)lVar15 - 1);
  }
  puVar16 = auStack_278 + local_2f8[0x10];
  if (tbl_bits < (int)uVar9) {
    uVar8 = 0;
  }
  else {
    iVar10 = 1 << ((byte)uVar9 & 0x1f);
    uVar8 = 0;
    do {
      do {
        uVar19 = (uint)uVar9;
        tbl[(int)uVar8] = (uint)*puVar16 << 0x10 | uVar19;
        if (uVar8 == iVar10 - 1U) {
          iVar14 = tbl_bits - uVar19;
          if (iVar14 == 0 || tbl_bits < (int)uVar19) {
            return;
          }
          do {
            memcpy(tbl + iVar10,tbl,(long)iVar10 * 4);
            iVar10 = iVar10 * 2;
            iVar14 = iVar14 + -1;
          } while (iVar14 != 0);
          return;
        }
        puVar16 = puVar16 + 1;
        uVar5 = uVar8 ^ iVar10 - 1U;
        uVar6 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar6 == 0; uVar6 = uVar6 - 1) {
          }
        }
        uVar8 = uVar8 & (1 << ((byte)uVar6 & 0x1f)) - 1U | 1 << (uVar6 & 0x1f);
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
      uVar9 = (long)(int)uVar19;
      do {
        uVar20 = uVar9;
        if ((long)uVar20 < (long)tbl_bits) {
          memcpy(tbl + iVar10,tbl,(long)iVar10 * 4);
          iVar10 = iVar10 * 2;
        }
        iVar14 = local_2f8[uVar20 + 1];
        uVar9 = uVar20 + 1;
      } while (iVar14 == 0);
    } while ((int)uVar20 < tbl_bits);
  }
  iVar10 = 1 << (bVar4 & 0x1f);
  uVar19 = iVar10 - 1;
  iVar13 = 0;
  uVar6 = 0xffffffff;
  do {
    iVar18 = (int)uVar9;
    uVar5 = iVar18 - tbl_bits;
    iVar2 = 1 << ((byte)uVar5 & 0x1f);
    uVar17 = ~(-1 << ((byte)uVar9 & 0x1f));
    iVar12 = iVar10;
    do {
      uVar11 = uVar8 & uVar19;
      iVar10 = iVar12;
      if (uVar11 != uVar6) {
        piVar3 = local_2f8 + (long)iVar18 + 1;
        uVar6 = uVar5;
        iVar13 = iVar2;
        iVar10 = iVar14;
        if (iVar14 < iVar2) {
          do {
            uVar6 = uVar6 + 1;
            iVar13 = 1 << ((byte)uVar6 & 0x1f);
            iVar10 = iVar10 * 2 + *piVar3;
            piVar3 = piVar3 + 1;
          } while (iVar10 < iVar13);
        }
        tbl[uVar11] = (uVar6 & 0xf) + iVar12 * 0x10000 + 0x10;
        iVar10 = iVar13 + iVar12;
        uVar6 = uVar11;
        iVar13 = iVar12;
      }
      uVar1 = *puVar16;
      lVar15 = (long)(((int)uVar8 >> (bVar4 & 0x1f)) + iVar13);
      do {
        tbl[lVar15] = (uint)uVar1 * 0x10000 + (uVar5 & 0xf);
        lVar15 = lVar15 + iVar2;
      } while (lVar15 < iVar10);
      if (uVar8 == uVar17) {
        return;
      }
      uVar7 = uVar8 ^ uVar17;
      uVar11 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      puVar16 = puVar16 + 1;
      uVar8 = uVar8 & (1 << ((byte)uVar11 & 0x1f)) - 1U | 1 << (uVar11 & 0x1f);
      iVar14 = iVar14 + -1;
      iVar12 = iVar10;
    } while (iVar14 != 0);
    piVar3 = local_2f8 + (long)iVar18 + 1;
    do {
      iVar14 = *piVar3;
      uVar9 = (ulong)((int)uVar9 + 1);
      piVar3 = piVar3 + 1;
    } while (iVar14 == 0);
  } while( true );
}

Assistant:

static void
sinfl_build(unsigned *tbl, unsigned char *lens, int tbl_bits, int maxlen,
            int symcnt) {
  int i, used = 0;
  short sort[288];
  int cnt[16] = {0}, off[16]= {0};
  struct sinfl_gen gen = {0};
  gen.sorted = sort;
  gen.len = 1;

  for (i = 0; i < symcnt; ++i)
    cnt[lens[i]]++;
  off[1] = cnt[0];
  for (i = 1; i < maxlen; ++i) {
    off[i + 1] = off[i] + cnt[i];
    used = (used << 1) + cnt[i];
  }
  used = (used << 1) + cnt[i];
  for (i = 0; i < symcnt; ++i)
    gen.sorted[off[lens[i]]++] = (short)i;
  gen.sorted += off[0];

  if (used < (1 << maxlen)){
    for (i = 0; i < 1 << tbl_bits; ++i)
      tbl[i] = (0 << 16u) | 1;
    return;
  }
  if (!sinfl_build_tbl(&gen, tbl, tbl_bits, cnt)){
    sinfl_build_subtbl(&gen, tbl, tbl_bits, cnt);
  }
}